

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O2

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::perform_dwarf_fission_resolution
          (dwarf_resolver *this,die_object *cu_die,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
          *dwo_name,object_frame *object_frame_info,stacktrace_frame *frame,
          vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *inlines)

{
  long *plVar1;
  dwarf_resolver *pdVar2;
  cache_mode cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false>
  _Var5;
  int __flags;
  void *__child_stack;
  void *__child_stack_00;
  stacktrace_frame *__arg;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false,_false>,_bool>
  pVar6;
  Dwarf_Half dwversion;
  dwarf_resolver *local_368;
  Dwarf_Half offset_size;
  dwarf_resolver *local_358;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *local_350;
  string path;
  Dwarf_Off off;
  Dwarf_Die pDStack_320;
  Dwarf_Half local_318;
  undefined4 local_316;
  undefined2 local_312;
  _Alloc_hider local_310;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
  comp_dir;
  frame_with_inlines res;
  anon_union_32_2_d41c7fdf_for_optional<cpptrace::detail::libdwarf::skeleton_info,_0>_2 local_208;
  undefined1 local_1e8;
  anon_union_32_2_d41c7fdf_for_optional<cpptrace::detail::libdwarf::skeleton_info,_0>_2 local_1d8;
  undefined1 local_1b8;
  dwarf_resolver resolver;
  
  if (dwo_name->holds_value != true) {
    return;
  }
  __arg = frame;
  local_350 = inlines;
  die_object::get_string_attribute_abi_cxx11_(&comp_dir,cu_die,0x1b);
  offset_size = 0;
  dwversion = 0;
  dwarf_get_version_of_die(cu_die->die,&dwversion,&offset_size);
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  pbVar4 = optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
           ::unwrap(dwo_name);
  if ((pbVar4->_M_string_length == 0) || (*(pbVar4->_M_dataplus)._M_p != '/')) {
    if (comp_dir.holds_value != true) goto LAB_00135f9c;
    pbVar4 = optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
             ::unwrap(&comp_dir);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,pbVar4,
                   '/');
    pbVar4 = optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
             ::unwrap(dwo_name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resolver,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,pbVar4)
    ;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resolver)
    ;
    std::__cxx11::string::~string((string *)&resolver);
    std::__cxx11::string::~string((string *)&res);
  }
  else {
    pbVar4 = optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
             ::unwrap(dwo_name);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&path,pbVar4);
  }
  res.frame.filename._M_dataplus._M_p = (pointer)&res.frame.filename.field_2;
  res.frame.filename._M_string_length = 0;
  __flags = 0;
  res.frame.filename.field_2._M_local_buf[0] = '\0';
  res.frame.symbol._M_dataplus._M_p = (pointer)&res.frame.symbol.field_2;
  res.frame.symbol._M_string_length = 0;
  res.frame.symbol.field_2._M_local_buf[0] = '\0';
  res.inlines.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  res.inlines.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  res.inlines.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar3 = get_cache_mode();
  if (cVar3 == prioritize_memory) {
    die_object::clone((die_object *)&off,(__fn *)cu_die,__child_stack,__flags,__arg);
    local_318 = dwversion;
    local_1b8 = 1;
    local_1d8.uvalue.cu_die.dbg = (Dwarf_Debug)off;
    local_1d8.uvalue.cu_die.die = pDStack_320;
    off = 0;
    pDStack_320 = (Dwarf_Die)0x0;
    local_1d8.uvalue.dwversion = dwversion;
    local_1d8._18_4_ = local_316;
    local_1d8._22_2_ = local_312;
    local_310._M_p = (pointer)this;
    local_1d8.uvalue.resolver = this;
    dwarf_resolver(&resolver,&path,
                   (optional<cpptrace::detail::libdwarf::skeleton_info,_0> *)&local_1d8.uvalue);
    optional<cpptrace::detail::libdwarf::skeleton_info,_0>::reset
              ((optional<cpptrace::detail::libdwarf::skeleton_info,_0> *)&local_1d8.uvalue);
    die_object::~die_object((die_object *)&off);
    resolve_frame((frame_with_inlines *)&off,&resolver,object_frame_info);
    frame_with_inlines::operator=(&res,(frame_with_inlines *)&off);
    frame_with_inlines::~frame_with_inlines((frame_with_inlines *)&off);
    ~dwarf_resolver(&resolver);
  }
  else {
    off = die_object::get_global_offset(cu_die);
    _Var5._M_cur = (__node_type *)
                   std::
                   _Hashtable<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(this->split_full_cu_resolvers)._M_h,&off);
    if (_Var5._M_cur == (__node_type *)0x0) {
      local_358 = (dwarf_resolver *)operator_new(0x170);
      die_object::clone((die_object *)&resolver,(__fn *)cu_die,__child_stack_00,__flags,__arg);
      pdVar2 = local_358;
      resolver.object_path._M_string_length._0_2_ = dwversion;
      local_1e8 = 1;
      local_208.uvalue.cu_die.dbg =
           (Dwarf_Debug)resolver.super_symbol_resolver._vptr_symbol_resolver;
      local_208.uvalue.cu_die.die = (Dwarf_Die)resolver.object_path._M_dataplus._M_p;
      resolver.super_symbol_resolver._vptr_symbol_resolver = (_func_int **)0x0;
      resolver.object_path._M_dataplus._M_p = (pointer)0x0;
      local_208.uvalue.dwversion = dwversion;
      local_208._18_4_ = resolver.object_path._M_string_length._2_4_;
      local_208._22_2_ = resolver.object_path._M_string_length._6_2_;
      local_208.uvalue.resolver = this;
      resolver.object_path.field_2._M_allocated_capacity = (size_type)this;
      dwarf_resolver(local_358,&path,
                     (optional<cpptrace::detail::libdwarf::skeleton_info,_0> *)&local_208.uvalue);
      local_368 = pdVar2;
      pVar6 = std::
              _Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>>,std::allocator<std::pair<unsigned_long_long_const,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::
              _M_emplace<unsigned_long_long&,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>>
                        ((_Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>>,std::allocator<std::pair<unsigned_long_long_const,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&this->split_full_cu_resolvers,&off);
      _Var5._M_cur = (__node_type *)
                     pVar6.first.
                     super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false>
                     ._M_cur;
      if (local_368 != (dwarf_resolver *)0x0) {
        (*(local_368->super_symbol_resolver)._vptr_symbol_resolver[1])();
      }
      local_368 = (dwarf_resolver *)0x0;
      optional<cpptrace::detail::libdwarf::skeleton_info,_0>::reset
                ((optional<cpptrace::detail::libdwarf::skeleton_info,_0> *)&local_208.uvalue);
      die_object::~die_object((die_object *)&resolver);
    }
    plVar1 = *(long **)((long)&((_Var5._M_cur)->
                               super__Hash_node_value<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>_>
                               ._M_storage._M_storage + 8);
    (**(code **)(*plVar1 + 0x10))(&resolver,plVar1,object_frame_info);
    frame_with_inlines::operator=(&res,(frame_with_inlines *)&resolver);
    frame_with_inlines::~frame_with_inlines((frame_with_inlines *)&resolver);
  }
  stacktrace_frame::operator=(frame,&res.frame);
  std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::
  _M_move_assign(local_350,&res.inlines);
  frame_with_inlines::~frame_with_inlines(&res);
LAB_00135f9c:
  std::__cxx11::string::~string((string *)&path);
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::
  reset(&comp_dir);
  return;
}

Assistant:

void perform_dwarf_fission_resolution(
            const die_object& cu_die,
            const optional<std::string>& dwo_name,
            const object_frame& object_frame_info,
            stacktrace_frame& frame,
            std::vector<stacktrace_frame>& inlines
        ) {
            // Split dwarf / debug fission / dwo is handled here
            // Location of the split full CU is a combination of DW_AT_dwo_name/DW_AT_GNU_dwo_name and DW_AT_comp_dir
            // https://gcc.gnu.org/wiki/DebugFission
            if(dwo_name) {
                // TODO: DWO ID?
                auto comp_dir = cu_die.get_string_attribute(DW_AT_comp_dir);
                Dwarf_Half offset_size = 0;
                Dwarf_Half dwversion = 0;
                dwarf_get_version_of_die(cu_die.get(), &dwversion, &offset_size);
                std::string path;
                if(is_absolute(dwo_name.unwrap())) {
                    path = dwo_name.unwrap();
                } else if(comp_dir) {
                    path = comp_dir.unwrap() + PATH_SEP + dwo_name.unwrap();
                } else {
                    // maybe default to dwo_name but for now not doing anything
                    return;
                }
                // todo: slight inefficiency in this copy-back strategy due to other frame members
                frame_with_inlines res;
                if(get_cache_mode() == cache_mode::prioritize_memory) {
                    dwarf_resolver resolver(
                        path,
                        skeleton_info{cu_die.clone(), dwversion, *this}
                    );
                    res = resolver.resolve_frame(object_frame_info);
                } else {
                    auto off = cu_die.get_global_offset();
                    auto it = split_full_cu_resolvers.find(off);
                    if(it == split_full_cu_resolvers.end()) {
                        it = split_full_cu_resolvers.emplace(
                            off,
                            std::unique_ptr<dwarf_resolver>(
                                new dwarf_resolver(
                                    path,
                                    skeleton_info{cu_die.clone(), dwversion, *this}
                                )
                            )
                        ).first;
                    }
                    res = it->second->resolve_frame(object_frame_info);
                }
                frame = std::move(res.frame);
                inlines = std::move(res.inlines);
            }
        }